

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenTypePrimitiveReader.cpp
# Opt level: O3

EStatusCode __thiscall
OpenTypePrimitiveReader::Read
          (OpenTypePrimitiveReader *this,Byte *inBuffer,LongBufferSizeType inBufferSize)

{
  EStatusCode EVar1;
  int iVar2;
  undefined4 extraout_var;
  
  EVar1 = eFailure;
  if (this->mInternalState != eFailure) {
    iVar2 = (*(this->mOpenTypeFile->super_IByteReader)._vptr_IByteReader[2])();
    EVar1 = eSuccess;
    if (CONCAT44(extraout_var,iVar2) != inBufferSize) {
      this->mInternalState = eFailure;
      EVar1 = eFailure;
    }
  }
  return EVar1;
}

Assistant:

EStatusCode OpenTypePrimitiveReader::Read(Byte* inBuffer,LongBufferSizeType inBufferSize)
{
	if(PDFHummus::eFailure == mInternalState)
		return PDFHummus::eFailure;

	EStatusCode status = (mOpenTypeFile->Read(inBuffer,inBufferSize) == inBufferSize ? PDFHummus::eSuccess : PDFHummus::eFailure);

	if(PDFHummus::eFailure == status)
		mInternalState = PDFHummus::eFailure;
	return status;	
}